

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  int iVar13;
  long lVar14;
  undefined1 (*pauVar15) [32];
  int iVar16;
  undefined1 (*pauVar17) [32];
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  
  uVar2 = b->c;
  iVar13 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar16 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar18 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar18 = 0;
    }
    for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
      fVar1 = *a->data;
      auVar19._4_4_ = fVar1;
      auVar19._0_4_ = fVar1;
      auVar19._8_4_ = fVar1;
      auVar19._12_4_ = fVar1;
      auVar20._16_4_ = fVar1;
      auVar20._0_16_ = auVar19;
      auVar20._20_4_ = fVar1;
      auVar20._24_4_ = fVar1;
      auVar20._28_4_ = fVar1;
      pvVar3 = b->data;
      sVar4 = b->elemsize;
      sVar5 = b->cstep;
      pauVar17 = (undefined1 (*) [32])(sVar5 * uVar12 * sVar4 + (long)pvVar3);
      pvVar6 = c->data;
      sVar7 = c->elemsize;
      sVar8 = c->cstep;
      pauVar15 = (undefined1 (*) [32])(sVar8 * uVar12 * sVar7 + (long)pvVar6);
      lVar14 = 0;
      for (iVar16 = 0; iVar16 + 7 < iVar13; iVar16 = iVar16 + 8) {
        auVar9 = vrcpps_avx(*pauVar17);
        auVar22._0_4_ = fVar1 * auVar9._0_4_;
        auVar22._4_4_ = fVar1 * auVar9._4_4_;
        auVar22._8_4_ = fVar1 * auVar9._8_4_;
        auVar22._12_4_ = fVar1 * auVar9._12_4_;
        auVar22._16_4_ = fVar1 * auVar9._16_4_;
        auVar22._20_4_ = fVar1 * auVar9._20_4_;
        auVar22._28_36_ = in_ZMM3._28_36_;
        auVar22._24_4_ = fVar1 * auVar9._24_4_;
        auVar21 = auVar22._0_32_;
        in_ZMM3 = ZEXT3264(auVar21);
        auVar11 = vfmsub213ps_fma(*pauVar17,auVar21,auVar20);
        auVar11 = vfnmadd213ps_fma(ZEXT1632(auVar11),auVar9,auVar21);
        *pauVar15 = ZEXT1632(auVar11);
        pauVar17 = pauVar17 + 1;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 8;
      }
      auVar19 = vshufps_avx(auVar19,auVar19,0);
      for (; iVar16 + 3 < iVar13; iVar16 = iVar16 + 4) {
        auVar11 = vrcpps_avx(*(undefined1 (*) [16])*pauVar17);
        in_ZMM3 = ZEXT1664(auVar11);
        auVar23._0_4_ = auVar19._0_4_ * auVar11._0_4_;
        auVar23._4_4_ = auVar19._4_4_ * auVar11._4_4_;
        auVar23._8_4_ = auVar19._8_4_ * auVar11._8_4_;
        auVar23._12_4_ = auVar19._12_4_ * auVar11._12_4_;
        auVar10 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar17,auVar23,auVar19);
        auVar11 = vfnmadd213ps_fma(auVar10,auVar11,auVar23);
        *(undefined1 (*) [16])*pauVar15 = auVar11;
        pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
        pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 0x10);
        lVar14 = lVar14 + 4;
      }
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        *(float *)((long)pvVar6 + lVar14 * 4 + sVar8 * sVar7 * uVar12) =
             fVar1 / *(float *)((long)pvVar3 + lVar14 * 4 + sVar5 * sVar4 * uVar12);
      }
    }
    iVar16 = 0;
  }
  return iVar16;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}